

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

bool __thiscall gss::innards::HomomorphismModel::prepare(HomomorphismModel *this)

{
  _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __last;
  _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __last_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint uVar4;
  pointer pIVar5;
  uint *puVar6;
  ulong uVar7;
  reference pvVar8;
  vector<int,_std::allocator<int>_> *n_p_00;
  vector<int,_std::allocator<int>_> *pvVar9;
  NamedVertex *t_00;
  undefined8 uVar10;
  __tuple_element_t<2UL,_tuple<unique_ptr<InputGraph,_default_delete<InputGraph>_>,_bool,_int>_>
  *p_Var11;
  size_type sVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reference this_00;
  reference pvVar13;
  int *piVar14;
  byte *pbVar15;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  uint j_2;
  uint i_10;
  uint g_3;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint g_2;
  uint g_1;
  uint v_3;
  value_type n_t_3;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t_1;
  NamedVertex named_t_2;
  uint t_4;
  NamedVertex named_q_2;
  NamedVertex named_p_2;
  uint q_2;
  uint p_4;
  type *count;
  type *injective;
  type *shape;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
  *__range1;
  uint x_1;
  value_type n_w;
  uint w_4;
  value_type n_v_1;
  uint v_2;
  value_type n_t_2;
  set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d3_from_t_set;
  set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d2_from_t_set;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d3_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d2_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d1_from_t;
  NamedVertex named_t_1;
  uint t_3;
  uint w_3;
  value_type n_v;
  uint v_1;
  value_type n_p_q_1;
  value_type n_q;
  value_type n_p_1;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_from_p_to_q_2;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_from_p_to_q_1;
  bool actually_adjacent;
  NamedVertex named_q_1;
  NamedVertex named_p_1;
  uint q_1;
  uint p_3;
  uint x;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t_w;
  value_type n_t_w;
  uint w_2;
  value_type n2_t;
  uint w_1;
  value_type nd_t;
  uint w;
  value_type n_t_1;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  named_two_away_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_d_n_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t;
  NamedVertex named_t;
  uint t_2;
  uint v;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  between_p_and_q;
  value_type n_p_q;
  NamedVertex named_q;
  NamedVertex named_p;
  uint q;
  uint p_2;
  int g;
  uint next_target_supplemental;
  uint next_pattern_supplemental;
  uint t_1;
  uint p_1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targets;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  patterns;
  uint j_1;
  value_type nt;
  vector<int,_std::allocator<int>_> n_t;
  uint t;
  uint j;
  value_type np;
  vector<int,_std::allocator<int>_> n_p;
  uint p;
  uint i_4;
  uint i_3;
  uint i_2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_gds;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_gds;
  uint i_1;
  uint i;
  SVOBitset *in_stack_ffffffffffffebd8;
  undefined4 uVar17;
  HomomorphismParams *in_stack_ffffffffffffebe0;
  unique_ptr<InputGraph,_std::default_delete<InputGraph>_> *this_01;
  SVOBitset *in_stack_ffffffffffffebe8;
  SVOBitset *in_stack_ffffffffffffebf0;
  undefined4 in_stack_ffffffffffffebf8;
  int in_stack_ffffffffffffebfc;
  _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffec00;
  uint in_stack_ffffffffffffec0c;
  int iVar18;
  undefined4 in_stack_ffffffffffffec10;
  undefined4 in_stack_ffffffffffffec14;
  char *in_stack_ffffffffffffec18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec20;
  undefined4 in_stack_ffffffffffffec28;
  undefined4 in_stack_ffffffffffffec2c;
  int in_stack_ffffffffffffec44;
  HomomorphismModel *in_stack_ffffffffffffec48;
  HomomorphismModel *this_02;
  uint in_stack_ffffffffffffec98;
  undefined4 in_stack_ffffffffffffec9c;
  _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffeca0;
  uint in_stack_ffffffffffffeca8;
  undefined4 in_stack_ffffffffffffecac;
  _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffecb0;
  uint in_stack_ffffffffffffecbc;
  Proof *in_stack_ffffffffffffecc0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffecd0;
  undefined2 in_stack_ffffffffffffecd8;
  undefined1 in_stack_ffffffffffffecda;
  byte in_stack_ffffffffffffecdb;
  uint in_stack_ffffffffffffecdc;
  uint in_stack_ffffffffffffece0;
  uint in_stack_ffffffffffffece4;
  uint in_stack_ffffffffffffece8;
  undefined1 in_stack_ffffffffffffecec;
  undefined1 in_stack_ffffffffffffeced;
  NamedVertex *in_stack_ffffffffffffecf0;
  int in_stack_ffffffffffffecfc;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
  *in_stack_ffffffffffffed00;
  reference in_stack_ffffffffffffed60;
  reference in_stack_ffffffffffffed68;
  element_type *in_stack_ffffffffffffed70;
  reference in_stack_ffffffffffffed78;
  uint in_stack_ffffffffffffed80;
  uint in_stack_ffffffffffffed84;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *this_03;
  undefined7 in_stack_ffffffffffffeda0;
  undefined1 in_stack_ffffffffffffeda7;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *this_04;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffede0;
  NamedVertex *in_stack_ffffffffffffede8;
  NamedVertex *in_stack_ffffffffffffedf0;
  NamedVertex *in_stack_ffffffffffffedf8;
  HomomorphismModel *in_stack_ffffffffffffee00;
  uint in_stack_ffffffffffffee0c;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_05;
  undefined4 in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee2c;
  uint uVar19;
  undefined4 in_stack_ffffffffffffee30;
  uint uVar20;
  undefined4 in_stack_ffffffffffffee34;
  uint local_11c8;
  uint local_11c4;
  uint local_11c0;
  uint local_11bc;
  uint local_11b8;
  uint local_11b4;
  uint local_11b0;
  NamedVertex *in_stack_ffffffffffffee78;
  undefined7 in_stack_ffffffffffffee80;
  undefined1 in_stack_ffffffffffffee87;
  NamedVertex *in_stack_ffffffffffffee88;
  undefined4 in_stack_ffffffffffffee90;
  uint in_stack_ffffffffffffee94;
  undefined4 in_stack_ffffffffffffee98;
  int in_stack_ffffffffffffee9c;
  HomomorphismModel *in_stack_ffffffffffffeea0;
  NamedVertex *in_stack_ffffffffffffeeb0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffeeb8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffeec0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffeec8;
  undefined1 in_stack_ffffffffffffef0e;
  undefined1 in_stack_ffffffffffffef0f;
  InputGraph *in_stack_ffffffffffffef10;
  uint *in_stack_ffffffffffffef18;
  uint in_stack_ffffffffffffef24;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
  *in_stack_ffffffffffffef28;
  HomomorphismModel *in_stack_ffffffffffffef30;
  int in_stack_ffffffffffffef40;
  uint local_101c;
  uint local_f4c;
  uint local_ef8;
  uint local_ef4;
  _Self local_ed0;
  _Self local_ec8;
  list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
  *local_ec0;
  _Base_ptr local_eb8;
  _Base_ptr local_eb0;
  _Base_ptr local_ea8;
  _Base_ptr local_ea0;
  _Base_ptr local_e98;
  undefined1 local_e90;
  uint local_e5c;
  _Base_ptr local_dd0;
  undefined1 local_dc8;
  uint local_d94;
  uint local_cdc;
  undefined1 local_bf0 [24];
  undefined1 local_bd8 [24];
  undefined1 local_bc0 [396];
  uint local_a34;
  NamedVertex *in_stack_fffffffffffff6a8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6b0;
  NamedVertex *in_stack_fffffffffffff6b8;
  NamedVertex *in_stack_fffffffffffff6c0;
  int in_stack_fffffffffffff6cc;
  Proof *in_stack_fffffffffffff6d0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6e0;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *in_stack_fffffffffffff6e8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6f0;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_868;
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_830;
  byte local_7f9;
  uint local_7a8;
  uint local_7a4;
  uint local_74c;
  uint local_6a4;
  uint local_5ec;
  uint local_534;
  undefined1 local_4a8 [48];
  undefined1 local_478 [360];
  uint local_310;
  uint local_30c;
  uint local_308;
  int local_304;
  uint local_300;
  int local_2fc;
  uint local_2cc;
  uint local_29c;
  uint local_218;
  uint local_214;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_bc;
  uint local_b8;
  pair<int,_int> *local_b0;
  pair<int,_int> *local_a8;
  pair<int,_int> *local_98;
  pair<int,_int> *local_90;
  uint local_88;
  uint local_84;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_68;
  uint local_4c;
  uint local_48;
  allocator<char> local_31 [48];
  byte local_1;
  
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x1536c4);
  bVar1 = is_nonshrinking(pIVar5->params);
  if ((bVar1) &&
     (*(uint *)&(in_RDI->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage <
      *(uint *)((long)&(in_RDI->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 4))) {
    local_1 = 0;
LAB_001572ec:
    return (bool)(local_1 & 1);
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x1536fc);
  this_05 = &pIVar5->supplemental_graph_names;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffec20,in_stack_ffffffffffffec18,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffebf0,(value_type *)in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffebe0);
  std::allocator<char>::~allocator(local_31);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x15377b);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec00._M_node,
             CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x1537b0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec00._M_node,
             CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
  for (local_48 = 0;
      local_48 <
      *(uint *)((long)&(in_RDI->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 4); local_48 = local_48 + 1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x153808);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              (&pIVar5->pattern_graph_rows,
               (ulong)(local_48 *
                      *(int *)&(in_RDI->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish));
    in_stack_ffffffffffffee0c = SVOBitset::count((SVOBitset *)in_stack_ffffffffffffec00._M_node);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15384a);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                                (size_type)in_stack_ffffffffffffebd8);
    *puVar6 = in_stack_ffffffffffffee0c;
  }
  for (local_4c = 0;
      local_4c <
      *(uint *)&(in_RDI->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage; local_4c = local_4c + 1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x153906);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              (&pIVar5->target_graph_rows,
               (ulong)(local_4c *
                      *(int *)&(in_RDI->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish));
    uVar4 = SVOBitset::count((SVOBitset *)in_stack_ffffffffffffec00._M_node);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x153948);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                                (size_type)in_stack_ffffffffffffebd8);
    *puVar6 = uVar4;
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x153998);
  bVar1 = global_degree_is_preserved(pIVar5->params);
  if (bVar1) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1539b6);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1539c3);
    for (local_84 = 0;
        local_84 <
        *(uint *)((long)&(in_RDI->
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish + 4); local_84 = local_84 + 1)
    {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x1539f3);
      in_stack_ffffffffffffee00 =
           (HomomorphismModel *)
           std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
      in_stack_ffffffffffffedf8 =
           (NamedVertex *)
           std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                      (size_type)in_stack_ffffffffffffebd8);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,int&>
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_ffffffffffffebf0,(uint *)in_stack_ffffffffffffebe8,
                 (int *)in_stack_ffffffffffffebe0);
    }
    for (local_88 = 0;
        local_88 <
        *(uint *)&(in_RDI->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage; local_88 = local_88 + 1) {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x153ab0);
      in_stack_ffffffffffffedf0 =
           (NamedVertex *)
           std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
      in_stack_ffffffffffffede8 =
           (NamedVertex *)
           std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                      (size_type)in_stack_ffffffffffffebd8);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int&,int&>
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_ffffffffffffebf0,(uint *)in_stack_ffffffffffffebe8,
                 (int *)in_stack_ffffffffffffebe0);
    }
    in_stack_ffffffffffffede0 = &local_68;
    local_90 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebd8);
    local_98 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebd8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,gss::innards::HomomorphismModel::prepare()::__0>
              (local_90,local_98);
    local_a8 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebd8);
    local_b0 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebd8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,gss::innards::HomomorphismModel::prepare()::__1>
              (local_a8,local_b0);
    local_b8 = 0;
LAB_00153bc1:
    uVar7 = (ulong)local_b8;
    sVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                       (&local_68);
    if (uVar7 < sVar12) {
      pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
      iVar18 = pvVar8->second;
      pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
      if (iVar18 <= pvVar8->second) goto LAB_0015435c;
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x153c68);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
      if (bVar1) {
        for (local_bc = 0; local_bc <= local_b8; local_bc = local_bc + 1) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x153ca9);
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x153cb6);
          this_04 = &pIVar5->pattern_graph_rows;
          pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (this_04,(ulong)(uint)(pvVar8->first *
                                          *(int *)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish));
          SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
          for (local_164 = 0;
              local_164 <
              *(uint *)((long)&(in_RDI->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + 4);
              local_164 = local_164 + 1) {
            in_stack_ffffffffffffeda7 =
                 SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
            if ((bool)in_stack_ffffffffffffeda7) {
              local_168 = local_164;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                         (value_type_conflict1 *)in_stack_ffffffffffffebd8);
            }
          }
          local_16c = local_b8;
          while( true ) {
            n_p_00 = (vector<int,_std::allocator<int>_> *)(ulong)local_16c;
            pvVar9 = (vector<int,_std::allocator<int>_> *)
                     std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                               (&local_80);
            if (pvVar9 <= n_p_00) break;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x153e24);
            pIVar5 = std::
                     unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   *)0x153e31);
            this_03 = &pIVar5->target_graph_rows;
            t_00 = (NamedVertex *)
                   std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
            std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
            operator[](this_03,(ulong)(uint)(t_00->first *
                                            *(int *)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish));
            SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
            in_stack_ffffffffffffed84 =
                 SVOBitset::find_first
                           ((SVOBitset *)
                            CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
            local_214 = in_stack_ffffffffffffed84;
            while (local_214 != 0xffffffff) {
              SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                               in_stack_ffffffffffffebfc);
              local_218 = local_214;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0,
                         (value_type_conflict1 *)in_stack_ffffffffffffebd8);
              in_stack_ffffffffffffed80 =
                   SVOBitset::find_first
                             ((SVOBitset *)
                              CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
              local_214 = in_stack_ffffffffffffed80;
            }
            std::
            unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
            ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          *)0x153f6a);
            in_stack_ffffffffffffed70 =
                 std::
                 __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x153f76);
            in_stack_ffffffffffffed78 =
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
            pattern_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44)
            ;
            in_stack_ffffffffffffed68 =
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
            target_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
            Proof::incompatible_by_degrees
                      ((Proof *)pvVar8,(int)((ulong)this_04 >> 0x20),
                       (NamedVertex *)CONCAT17(in_stack_ffffffffffffeda7,in_stack_ffffffffffffeda0),
                       n_p_00,t_00,(vector<int,_std::allocator<int>_> *)this_03);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x15403e);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x15404b);
            SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebf0);
            local_16c = local_16c + 1;
          }
          SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebf0);
        }
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x154137);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x154144);
        for (local_29c = 0; local_29c <= local_b8; local_29c = local_29c + 1) {
          in_stack_ffffffffffffed60 =
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
          pattern_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1541c8);
        }
        for (local_2cc = 0; local_2cc < local_b8; local_2cc = local_2cc + 1) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
          target_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1542a1);
        }
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x1542e7);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1542f3);
        Proof::emit_hall_set_or_violator
                  ((Proof *)CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0),
                   (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffecdc,
                               CONCAT13(in_stack_ffffffffffffecdb,
                                        CONCAT12(in_stack_ffffffffffffecda,in_stack_ffffffffffffecd8
                                                ))),in_stack_ffffffffffffecd0);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffebf0);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffebf0);
      }
      local_1 = 0;
      local_2fc = 1;
    }
    else {
      local_2fc = 0;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffebf0);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffebf0);
    if (local_2fc != 0) goto LAB_001572ec;
  }
  local_300 = 1;
  local_304 = 1;
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x1543ed);
  bVar1 = supports_exact_path_graphs(pIVar5->params);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffed70 >> 0x20);
  uVar2 = (undefined1)((ulong)in_stack_ffffffffffffed60 >> 0x38);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15440b);
    uVar20 = (uint)((ulong)in_stack_ffffffffffffebe0 >> 0x20);
    uVar4 = (uint)((ulong)in_stack_ffffffffffffebd8 >> 0x20);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15442e);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x154448);
    _build_exact_path_graphs
              (in_stack_ffffffffffffee00,
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffedf8,(uint)((ulong)in_stack_ffffffffffffedf0 >> 0x20),
               (uint *)in_stack_ffffffffffffede8,(uint)((ulong)in_stack_ffffffffffffede0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x10,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 8,0));
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15449f);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x1544c2);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x1544dc);
    in_stack_ffffffffffffebd8 = (SVOBitset *)((ulong)uVar4 << 0x20);
    in_stack_ffffffffffffebe0 = (HomomorphismParams *)((ulong)uVar20 << 0x20);
    _build_exact_path_graphs
              (in_stack_ffffffffffffee00,
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffedf8,(uint)((ulong)in_stack_ffffffffffffedf0 >> 0x20),
               (uint *)in_stack_ffffffffffffede8,(uint)((ulong)in_stack_ffffffffffffede0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x10,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 8,0));
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x154533);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
    uVar4 = (uint)((ulong)in_stack_ffffffffffffed70 >> 0x20);
    uVar2 = (undefined1)((ulong)in_stack_ffffffffffffed60 >> 0x38);
    if (bVar1) {
      local_308 = 1;
      while( true ) {
        uVar20 = local_308;
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x15456e);
        uVar4 = (uint)((ulong)in_stack_ffffffffffffed70 >> 0x20);
        uVar2 = (undefined1)((ulong)in_stack_ffffffffffffed60 >> 0x38);
        if (pIVar5->params->number_of_exact_path_graphs < (int)uVar20) break;
        for (local_30c = 0;
            local_30c <
            *(uint *)((long)&(in_RDI->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4);
            local_30c = local_30c + 1) {
          for (local_310 = 0;
              local_310 <
              *(uint *)((long)&(in_RDI->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + 4);
              local_310 = local_310 + 1) {
            if (local_30c != local_310) {
              pIVar5 = std::
                       unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     *)0x1545e7);
              std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
              operator[](&pIVar5->pattern_graph_rows,
                         (ulong)(local_30c *
                                 *(int *)&(in_RDI->
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + local_308));
              bVar1 = SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                      in_stack_ffffffffffffebfc);
              if (bVar1) {
                pattern_vertex_for_proof_abi_cxx11_
                          (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                pattern_vertex_for_proof_abi_cxx11_
                          (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                pIVar5 = std::
                         unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       *)0x154670);
                std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                operator[](&pIVar5->pattern_graph_rows,
                           (ulong)(local_30c *
                                  *(int *)&(in_RDI->
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish));
                SVOBitset::SVOBitset
                          ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                pIVar5 = std::
                         unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       *)0x1546b2);
                std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                operator[](&pIVar5->pattern_graph_rows,
                           (ulong)(local_310 *
                                  *(int *)&(in_RDI->
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish));
                SVOBitset::operator&=(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x1546f4);
                local_478._116_4_ =
                     SVOBitset::find_first
                               ((SVOBitset *)
                                CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                while (local_478._116_4_ != 0xffffffff) {
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  pattern_vertex_for_proof_abi_cxx11_
                            (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8);
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x15477e);
                  sVar12 = std::
                           vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::size((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)(local_478 + 0x78));
                  if (local_308 <= sVar12) break;
                  local_478._116_4_ =
                       SVOBitset::find_first
                                 ((SVOBitset *)
                                  CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                }
                for (local_478._68_4_ = 0;
                    (uint)local_478._68_4_ <
                    *(uint *)&(in_RDI->
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_478._68_4_ = local_478._68_4_ + 1) {
                  target_vertex_for_proof_abi_cxx11_
                            (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)0x1548a3);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)0x1548b0);
                  std::
                  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            *)0x1548bd);
                  pIVar5 = std::
                           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         *)0x1548ca);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](&pIVar5->target_graph_rows,
                             (ulong)(uint)(local_478._68_4_ *
                                          *(int *)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish));
                  SVOBitset::SVOBitset
                            ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  local_534 = SVOBitset::find_first
                                        ((SVOBitset *)
                                         CONCAT44(in_stack_ffffffffffffebfc,
                                                  in_stack_ffffffffffffebf8));
                  while (local_534 != 0xffffffff) {
                    SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                     in_stack_ffffffffffffebfc);
                    target_vertex_for_proof_abi_cxx11_
                              (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8
                               );
                    std::
                    pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x154989);
                    local_534 = SVOBitset::find_first
                                          ((SVOBitset *)
                                           CONCAT44(in_stack_ffffffffffffebfc,
                                                    in_stack_ffffffffffffebf8));
                  }
                  pIVar5 = std::
                           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         *)0x154a17);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](&pIVar5->target_graph_rows,
                             (ulong)(local_478._68_4_ *
                                     *(int *)&(in_RDI->
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish +
                                    local_308));
                  SVOBitset::SVOBitset
                            ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  local_5ec = SVOBitset::find_first
                                        ((SVOBitset *)
                                         CONCAT44(in_stack_ffffffffffffebfc,
                                                  in_stack_ffffffffffffebf8));
                  while (local_5ec != 0xffffffff) {
                    SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                     in_stack_ffffffffffffebfc);
                    target_vertex_for_proof_abi_cxx11_
                              (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8
                               );
                    std::
                    pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x154adf);
                    local_5ec = SVOBitset::find_first
                                          ((SVOBitset *)
                                           CONCAT44(in_stack_ffffffffffffebfc,
                                                    in_stack_ffffffffffffebf8));
                  }
                  pIVar5 = std::
                           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         *)0x154b54);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](&pIVar5->target_graph_rows,
                             (ulong)(local_478._68_4_ *
                                     *(int *)&(in_RDI->
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish + 1));
                  SVOBitset::SVOBitset
                            ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  local_6a4 = SVOBitset::find_first
                                        ((SVOBitset *)
                                         CONCAT44(in_stack_ffffffffffffebfc,
                                                  in_stack_ffffffffffffebf8));
                  while (local_6a4 != 0xffffffff) {
                    SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                     in_stack_ffffffffffffebfc);
                    pIVar5 = std::
                             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           *)0x154be0);
                    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                    operator[](&pIVar5->target_graph_rows,
                               (ulong)(local_6a4 *
                                      *(int *)&(in_RDI->
                                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish));
                    SVOBitset::SVOBitset
                              ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                    pIVar5 = std::
                             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           *)0x154c22);
                    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                    operator[](&pIVar5->target_graph_rows,
                               (ulong)(uint)(local_478._68_4_ *
                                            *(int *)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish));
                    SVOBitset::operator&=(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x154c64);
                    local_74c = SVOBitset::find_first
                                          ((SVOBitset *)
                                           CONCAT44(in_stack_ffffffffffffebfc,
                                                    in_stack_ffffffffffffebf8));
                    while (local_74c != 0xffffffff) {
                      SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                       in_stack_ffffffffffffebfc);
                      target_vertex_for_proof_abi_cxx11_
                                (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffebe0,
                                  (value_type *)in_stack_ffffffffffffebd8);
                      std::
                      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x154cee);
                      local_74c = SVOBitset::find_first
                                            ((SVOBitset *)
                                             CONCAT44(in_stack_ffffffffffffebfc,
                                                      in_stack_ffffffffffffebf8));
                    }
                    target_vertex_for_proof_abi_cxx11_
                              (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                    std::
                    vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                    ::
                    emplace_back<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>&>
                              ((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                *)in_stack_ffffffffffffebf0,
                               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_ffffffffffffebe8,
                               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_ffffffffffffebe0);
                    std::
                    pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x154dd2);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffebf0);
                    SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                    local_6a4 = SVOBitset::find_first
                                          ((SVOBitset *)
                                           CONCAT44(in_stack_ffffffffffffebfc,
                                                    in_stack_ffffffffffffebf8));
                  }
                  std::
                  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                *)0x154e62);
                  std::
                  __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x154e6e);
                  in_stack_ffffffffffffebe8 = (SVOBitset *)(local_4a8 + 0x18);
                  in_stack_ffffffffffffebe0 = (HomomorphismParams *)local_4a8;
                  in_stack_ffffffffffffebd8 = (SVOBitset *)local_478;
                  Proof::create_exact_path_graphs
                            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,
                             in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                             in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
                             in_stack_fffffffffffff6e0,in_stack_fffffffffffff6e8,
                             in_stack_fffffffffffff6f0);
                  SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                  SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                  SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                  std::
                  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                             *)in_stack_ffffffffffffebf0);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffebf0);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffebf0);
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x154f20);
                }
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffebf0);
                SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x154fba);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x154fc7);
              }
            }
          }
        }
        local_308 = local_308 + 1;
      }
    }
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x155057);
  bVar1 = supports_distance2_graphs(in_stack_ffffffffffffebe0);
  if (bVar1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x155075);
    uVar20 = (uint)((ulong)in_stack_ffffffffffffebe0 >> 0x20);
    uVar17 = (undefined4)((ulong)in_stack_ffffffffffffebd8 >> 0x20);
    in_stack_ffffffffffffecf0 = (NamedVertex *)&pIVar5->pattern_graph_rows;
    in_stack_ffffffffffffecfc =
         *(int *)((long)&(in_RDI->
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish + 4);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x155098);
    _build_exact_path_graphs
              (in_stack_ffffffffffffee00,
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffedf8,(uint)((ulong)in_stack_ffffffffffffedf0 >> 0x20),
               (uint *)in_stack_ffffffffffffede8,(uint)((ulong)in_stack_ffffffffffffede0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x10,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 8,0));
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x1550ea);
    in_stack_ffffffffffffed00 = &pIVar5->target_graph_rows;
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15510d);
    in_stack_ffffffffffffebd8 = (SVOBitset *)CONCAT44(uVar17,1);
    in_stack_ffffffffffffebe0 = (HomomorphismParams *)((ulong)uVar20 << 0x20);
    _build_exact_path_graphs
              (in_stack_ffffffffffffee00,
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffedf8,(uint)((ulong)in_stack_ffffffffffffedf0 >> 0x20),
               (uint *)in_stack_ffffffffffffede8,(uint)((ulong)in_stack_ffffffffffffede0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 0x10,0),
               SUB81((ulong)in_stack_ffffffffffffede0 >> 8,0));
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x155162);
  bVar1 = supports_distance3_graphs(pIVar5->params);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x155180);
    _build_distance3_graphs
              ((HomomorphismModel *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffed78,uVar4,(uint *)in_stack_ffffffffffffed68,(bool)uVar2);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x1551b2);
    _build_distance3_graphs
              ((HomomorphismModel *)CONCAT44(in_stack_ffffffffffffed84,in_stack_ffffffffffffed80),
               (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_ffffffffffffed78,uVar4,(uint *)in_stack_ffffffffffffed68,(bool)uVar2);
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x1551e1);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
    if (bVar1) {
      for (local_7a4 = 0;
          local_7a4 <
          *(uint *)((long)&(in_RDI->
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 4);
          local_7a4 = local_7a4 + 1) {
        for (local_7a8 = 0;
            local_7a8 <
            *(uint *)((long)&(in_RDI->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4);
            local_7a8 = local_7a8 + 1) {
          pattern_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
          pattern_vertex_for_proof_abi_cxx11_(in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
          if (local_7a4 == local_7a8) {
LAB_001552ea:
            local_2fc = 0x43;
          }
          else {
            pIVar5 = std::
                     unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   *)0x155293);
            std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
            operator[](&pIVar5->pattern_graph_rows,
                       (ulong)(local_7a4 *
                               *(int *)&(in_RDI->
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + -1 + local_300
                              ));
            uVar2 = SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                    in_stack_ffffffffffffebfc);
            if (!(bool)uVar2) goto LAB_001552ea;
            local_7f9 = 0;
            std::
            optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::optional(&local_830);
            std::
            optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::optional(&local_868);
            pIVar5 = std::
                     unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   *)0x15535b);
            std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
            operator[](&pIVar5->pattern_graph_rows,
                       (ulong)(local_7a4 *
                              *(int *)&(in_RDI->
                                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish));
            SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
            uVar3 = SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                    in_stack_ffffffffffffebfc);
            if ((bool)uVar3) {
              local_7f9 = 1;
            }
            else {
              pIVar5 = std::
                       unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     *)0x155406);
              std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
              operator[](&pIVar5->pattern_graph_rows,
                         (ulong)(local_7a8 *
                                *(int *)&(in_RDI->
                                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish));
              SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8)
              ;
              SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8)
              ;
              SVOBitset::operator&=(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
              SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                               in_stack_ffffffffffffebfc);
              SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                               in_stack_ffffffffffffebfc);
              in_stack_ffffffffffffeced = SVOBitset::any(in_stack_ffffffffffffebe8);
              if ((bool)in_stack_ffffffffffffeced) {
                in_stack_ffffffffffffece8 =
                     SVOBitset::find_first
                               ((SVOBitset *)
                                CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                pattern_vertex_for_proof_abi_cxx11_
                          (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                std::optional<std::pair<int,std::__cxx11::string>>::operator=
                          ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffebf0,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffebe8);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x155511);
              }
              else {
                SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
                SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
                in_stack_ffffffffffffece4 =
                     SVOBitset::find_first
                               ((SVOBitset *)
                                CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                local_a34 = in_stack_ffffffffffffece4;
                while( true ) {
                  in_stack_ffffffffffffece0 = in_stack_ffffffffffffece0 & 0xffffff;
                  if (local_a34 != 0xffffffff) {
                    bVar1 = std::optional::operator_cast_to_bool
                                      ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)0x1555b8);
                    in_stack_ffffffffffffece0 =
                         CONCAT13(bVar1,(int3)in_stack_ffffffffffffece0) ^ 0xff000000;
                  }
                  if ((in_stack_ffffffffffffece0 & 0x1000000) == 0) break;
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  pIVar5 = std::
                           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         *)0x1555f4);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](&pIVar5->pattern_graph_rows,
                             (ulong)(local_a34 *
                                    *(int *)&(in_RDI->
                                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish));
                  SVOBitset::SVOBitset
                            ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  in_stack_ffffffffffffecdc =
                       SVOBitset::find_first
                                 ((SVOBitset *)
                                  CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                  local_bc0._252_4_ = in_stack_ffffffffffffecdc;
                  while( true ) {
                    in_stack_ffffffffffffecdb = 0;
                    if (local_bc0._252_4_ != 0xffffffff) {
                      bVar1 = std::optional::operator_cast_to_bool
                                        ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)0x1556af);
                      in_stack_ffffffffffffecdb = bVar1 ^ 0xff;
                    }
                    if ((in_stack_ffffffffffffecdb & 1) == 0) break;
                    SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                     in_stack_ffffffffffffebfc);
                    pIVar5 = std::
                             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           *)0x1556eb);
                    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                    operator[](&pIVar5->pattern_graph_rows,
                               (ulong)(uint)(local_bc0._252_4_ *
                                            *(int *)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish));
                    in_stack_ffffffffffffecda =
                         SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                         in_stack_ffffffffffffebfc);
                    if ((bool)in_stack_ffffffffffffecda) {
                      pattern_vertex_for_proof_abi_cxx11_
                                (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                      std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_ffffffffffffebf0,
                                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_ffffffffffffebe8);
                      std::
                      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x15577e);
                      pattern_vertex_for_proof_abi_cxx11_
                                (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                      std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_ffffffffffffebf0,
                                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_ffffffffffffebe8);
                      std::
                      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x1557be);
                    }
                    local_bc0._252_4_ =
                         SVOBitset::find_first
                                   ((SVOBitset *)
                                    CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                  }
                  SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                  local_a34 = SVOBitset::find_first
                                        ((SVOBitset *)
                                         CONCAT44(in_stack_ffffffffffffebfc,
                                                  in_stack_ffffffffffffebf8));
                }
              }
              bVar1 = std::optional::operator_cast_to_bool
                                ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)0x155856);
              if (!bVar1) {
                local_bc0[0x47] = 1;
                uVar10 = __cxa_allocate_exception(0x28);
                std::operator+((char *)CONCAT44(in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28)
                               ,in_stack_ffffffffffffec20);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffebe8,(char *)in_stack_ffffffffffffebe0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffebe8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffebe0);
                ProofError::ProofError
                          ((ProofError *)in_stack_ffffffffffffebe0,
                           (string *)in_stack_ffffffffffffebd8);
                local_bc0[0x47] = 0;
                __cxa_throw(uVar10,&ProofError::typeinfo,ProofError::~ProofError);
              }
              SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
              SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
            }
            for (local_bc0._64_4_ = 0;
                (uint)local_bc0._64_4_ <
                *(uint *)&(in_RDI->
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_bc0._64_4_ = local_bc0._64_4_ + 1) {
              target_vertex_for_proof_abi_cxx11_
                        (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x155a31);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x155a3e);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x155a4b);
              std::
              set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::set((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x155a58);
              std::
              set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::set((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x155a65);
              pIVar5 = std::
                       unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     *)0x155a72);
              std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
              operator[](&pIVar5->target_graph_rows,
                         (ulong)(uint)(local_bc0._64_4_ *
                                      *(int *)&(in_RDI->
                                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish));
              SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8)
              ;
              SVOBitset::set((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                             in_stack_ffffffffffffebfc);
              in_stack_ffffffffffffecbc =
                   SVOBitset::find_first
                             ((SVOBitset *)
                              CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
              local_cdc = in_stack_ffffffffffffecbc;
              while (local_cdc != 0xffffffff) {
                SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
                target_vertex_for_proof_abi_cxx11_
                          (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x155b47);
                pIVar5 = std::
                         unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       *)0x155b54);
                std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                operator[](&pIVar5->target_graph_rows,
                           (ulong)(local_cdc *
                                  *(int *)&(in_RDI->
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish));
                SVOBitset::SVOBitset
                          ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                SVOBitset::set((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                               in_stack_ffffffffffffebfc);
                local_d94 = SVOBitset::find_first
                                      ((SVOBitset *)
                                       CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8)
                                      );
                while (local_d94 != 0xffffffff) {
                  SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                   in_stack_ffffffffffffebfc);
                  target_vertex_for_proof_abi_cxx11_
                            (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                  pVar16 = std::
                           set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::insert((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_ffffffffffffec00._M_node,
                                    (value_type *)
                                    CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                  in_stack_ffffffffffffecb0 = pVar16.first._M_node;
                  local_dc8 = pVar16.second;
                  in_stack_ffffffffffffecac = CONCAT13(local_dc8,(int3)in_stack_ffffffffffffecac);
                  local_dd0 = in_stack_ffffffffffffecb0._M_node;
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x155c56);
                  pIVar5 = std::
                           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         *)0x155c63);
                  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
                  operator[](&pIVar5->target_graph_rows,
                             (ulong)(local_d94 *
                                    *(int *)&(in_RDI->
                                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish));
                  SVOBitset::SVOBitset
                            ((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  SVOBitset::set((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
                  in_stack_ffffffffffffeca8 =
                       SVOBitset::find_first
                                 ((SVOBitset *)
                                  CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                  local_e5c = in_stack_ffffffffffffeca8;
                  while (local_e5c != 0xffffffff) {
                    SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                     in_stack_ffffffffffffebfc);
                    target_vertex_for_proof_abi_cxx11_
                              (in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
                    pVar16 = std::
                             set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::insert((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_ffffffffffffec00._M_node,
                                      (value_type *)
                                      CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8))
                    ;
                    in_stack_ffffffffffffeca0 = pVar16.first._M_node;
                    local_e90 = pVar16.second;
                    in_stack_ffffffffffffec9c = CONCAT13(local_e90,(int3)in_stack_ffffffffffffec9c);
                    local_e98 = in_stack_ffffffffffffeca0._M_node;
                    std::
                    pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x155d65);
                    in_stack_ffffffffffffec98 =
                         SVOBitset::find_first
                                   ((SVOBitset *)
                                    CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
                    local_e5c = in_stack_ffffffffffffec98;
                  }
                  SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                  local_d94 = SVOBitset::find_first
                                        ((SVOBitset *)
                                         CONCAT44(in_stack_ffffffffffffebfc,
                                                  in_stack_ffffffffffffebf8));
                }
                SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
                local_cdc = SVOBitset::find_first
                                      ((SVOBitset *)
                                       CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8)
                                      );
              }
              local_ea0 = (_Base_ptr)
                          std::
                          set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::begin((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffebd8);
              local_ea8 = (_Base_ptr)
                          std::
                          set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::end((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffebd8);
              __last._M_node._4_4_ = in_stack_ffffffffffffebfc;
              __last._M_node._0_4_ = in_stack_ffffffffffffebf8;
              std::
              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              ::assign<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>,void>
                        ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffec00,__last);
              local_eb0 = (_Base_ptr)
                          std::
                          set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::begin((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffebd8);
              local_eb8 = (_Base_ptr)
                          std::
                          set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::end((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffebd8);
              __last_00._M_node._4_4_ = in_stack_ffffffffffffebfc;
              __last_00._M_node._0_4_ = in_stack_ffffffffffffebf8;
              std::
              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              ::assign<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>,void>
                        ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffec00,__last_00);
              if ((local_7f9 & 1) == 0) {
                bVar1 = std::optional::operator_cast_to_bool
                                  ((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)0x155ff5);
                if (bVar1) {
                  std::
                  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                *)0x15600b);
                  std::
                  __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x156017);
                  std::
                  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x15603c);
                  std::
                  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x156051);
                  in_stack_ffffffffffffebf0 = (SVOBitset *)local_bf0;
                  in_stack_ffffffffffffebe8 = (SVOBitset *)local_bd8;
                  in_stack_ffffffffffffebe0 = (HomomorphismParams *)local_bc0;
                  in_stack_ffffffffffffebd8 = (SVOBitset *)(local_bc0 + 0x18);
                  Proof::create_distance3_graphs
                            ((Proof *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
                             (NamedVertex *)
                             CONCAT44(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90),
                             in_stack_ffffffffffffee88,
                             (NamedVertex *)
                             CONCAT17(in_stack_ffffffffffffee87,in_stack_ffffffffffffee80),
                             in_stack_ffffffffffffee78,in_stack_ffffffffffffeeb0,
                             in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeec0,
                             in_stack_ffffffffffffeec8);
                }
                else {
                  std::
                  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                *)0x1560c6);
                  std::
                  __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1560d2);
                  std::
                  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x1560f7);
                  in_stack_ffffffffffffebe8 = (SVOBitset *)local_bf0;
                  in_stack_ffffffffffffebe0 = (HomomorphismParams *)local_bd8;
                  in_stack_ffffffffffffebd8 = (SVOBitset *)local_bc0;
                  Proof::create_distance3_graphs_but_actually_distance_2
                            ((Proof *)this_05,in_stack_ffffffffffffee0c,
                             (NamedVertex *)in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,
                             in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,in_RDI,
                             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
                }
              }
              else {
                std::
                unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              *)0x155fa4);
                std::
                __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x155fb0);
                Proof::create_distance3_graphs_but_actually_distance_1
                          ((Proof *)in_stack_ffffffffffffed00,in_stack_ffffffffffffecfc,
                           in_stack_ffffffffffffecf0,
                           (NamedVertex *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffeced,
                                                                  CONCAT14(in_stack_ffffffffffffecec
                                                                           ,
                                                  in_stack_ffffffffffffece8)))),
                           (NamedVertex *)
                           CONCAT44(in_stack_ffffffffffffece4,in_stack_ffffffffffffece0),
                           (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffecdc,
                                       CONCAT13(in_stack_ffffffffffffecdb,
                                                CONCAT12(in_stack_ffffffffffffecda,
                                                         in_stack_ffffffffffffecd8))));
              }
              SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
              std::
              set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~set((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x15616c);
              std::
              set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~set((set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x156179);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffebf0);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffebf0);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffebf0);
              std::
              pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1561ad);
            }
            SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
            std::
            optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~optional((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x15623a);
            std::
            optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~optional((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x156247);
            local_2fc = 0;
          }
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x15625f);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x15626c);
        }
      }
    }
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x156302);
  bVar1 = supports_k4_graphs(pIVar5->params);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15631d);
    _build_k4_graphs(in_stack_ffffffffffffeea0,
                     (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                     CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
                     in_stack_ffffffffffffee94,(uint *)in_stack_ffffffffffffee88,
                     (bool)in_stack_ffffffffffffee87);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x15634f);
    _build_k4_graphs(in_stack_ffffffffffffeea0,
                     (vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                     CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
                     in_stack_ffffffffffffee94,(uint *)in_stack_ffffffffffffee88,
                     (bool)in_stack_ffffffffffffee87);
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x15637e);
  local_ec0 = &pIVar5->params->extra_shapes;
  local_ec8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
       ::begin((list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
                *)in_stack_ffffffffffffebd8);
  local_ed0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
       ::end((list<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
              *)in_stack_ffffffffffffebd8);
  while (bVar1 = std::operator==(&local_ec8,&local_ed0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _List_const_iterator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>
    ::operator*((_List_const_iterator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>
                 *)in_stack_ffffffffffffebe0);
    uVar17 = (undefined4)((ulong)in_stack_ffffffffffffebd8 >> 0x20);
    std::get<0ul,std::unique_ptr<InputGraph,std::default_delete<InputGraph>>,bool,int>
              ((tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int> *)
               0x1563f9);
    std::get<1ul,std::unique_ptr<InputGraph,std::default_delete<InputGraph>>,bool,int>
              ((tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int> *)
               0x15640e);
    p_Var11 = std::get<2ul,std::unique_ptr<InputGraph,std::default_delete<InputGraph>>,bool,int>
                        ((tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>
                          *)0x156423);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x156438);
    iVar18 = *(int *)((long)&(in_RDI->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4);
    std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>::operator*
              ((unique_ptr<InputGraph,_std::default_delete<InputGraph>_> *)in_stack_ffffffffffffebe0
              );
    this_01 = (unique_ptr<InputGraph,_std::default_delete<InputGraph>_> *)
              CONCAT44((int)((ulong)in_stack_ffffffffffffebe0 >> 0x20),1);
    _build_extra_shape(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef24
                       ,in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                       (bool)in_stack_ffffffffffffef0f,in_stack_ffffffffffffef40,
                       (bool)in_stack_ffffffffffffef0e);
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x1564b6);
    this_02 = (HomomorphismModel *)&pIVar5->target_graph_rows;
    std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>::operator*(this_01);
    in_stack_ffffffffffffebd8 = (SVOBitset *)CONCAT44(uVar17,*p_Var11);
    in_stack_ffffffffffffebe0 = (HomomorphismParams *)((ulong)this_01 & 0xffffffff00000000);
    _build_extra_shape(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef24
                       ,in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                       (bool)in_stack_ffffffffffffef0f,in_stack_ffffffffffffef40,
                       (bool)in_stack_ffffffffffffef0e);
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x156537);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
    if (bVar1) {
      for (local_ef4 = 0;
          local_ef4 <
          *(uint *)((long)&(in_RDI->
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 4);
          local_ef4 = local_ef4 + 1) {
        for (local_ef8 = 0;
            local_ef8 <
            *(uint *)((long)&(in_RDI->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4);
            local_ef8 = local_ef8 + 1) {
          pattern_vertex_for_proof_abi_cxx11_(this_02,iVar18);
          pattern_vertex_for_proof_abi_cxx11_(this_02,iVar18);
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x1565d9);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->pattern_graph_rows,
                     (ulong)(local_ef4 *
                             *(int *)&(in_RDI->
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + -1 + local_300))
          ;
          bVar1 = SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                  in_stack_ffffffffffffebfc);
          if (bVar1) {
            for (local_f4c = 0;
                local_f4c <
                *(uint *)&(in_RDI->
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_f4c = local_f4c + 1) {
              target_vertex_for_proof_abi_cxx11_(this_02,iVar18);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x1566ba);
              pIVar5 = std::
                       unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     *)0x1566c7);
              std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
              operator[](&pIVar5->target_graph_rows,
                         (ulong)(local_f4c *
                                 *(int *)&(in_RDI->
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish + -1 +
                                local_300));
              SVOBitset::SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8)
              ;
              local_101c = SVOBitset::find_first
                                     ((SVOBitset *)
                                      CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8))
              ;
              while (local_101c != 0xffffffff) {
                SVOBitset::reset((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                 in_stack_ffffffffffffebfc);
                target_vertex_for_proof_abi_cxx11_(this_02,iVar18);
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffebe0,(value_type *)in_stack_ffffffffffffebd8);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x15678f);
                local_101c = SVOBitset::find_first
                                       ((SVOBitset *)
                                        CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8
                                                ));
              }
              std::
              unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            *)0x156817);
              std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x156823);
              Proof::hack_in_shape_graph
                        (in_stack_ffffffffffffecc0,in_stack_ffffffffffffecbc,
                         (NamedVertex *)in_stack_ffffffffffffecb0._M_node,
                         (NamedVertex *)
                         CONCAT44(in_stack_ffffffffffffecac,in_stack_ffffffffffffeca8),
                         (NamedVertex *)in_stack_ffffffffffffeca0._M_node,
                         (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98));
              SVOBitset::~SVOBitset((SVOBitset *)in_stack_ffffffffffffebe0);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffebf0);
              std::
              pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x15687d);
            }
            local_2fc = 0;
          }
          else {
            local_2fc = 0x5d;
          }
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1568d4);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1568e1);
        }
      }
    }
    std::
    _List_const_iterator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>
    ::operator++(&local_ec8);
  }
  if ((local_300 ==
       *(uint *)&(in_RDI->
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) &&
     (local_304 ==
      *(int *)&(in_RDI->
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    uVar7 = (ulong)local_300;
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x156996);
    sVar12 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffebe0);
    if (uVar7 == sVar12) {
      for (local_11b0 = 1;
          local_11b0 <
          *(uint *)&(in_RDI->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; local_11b0 = local_11b0 + 1) {
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x156d45);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec00._M_node,
                   CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x156d7f);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec00._M_node,
                   CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
      }
      for (local_11b4 = 1;
          local_11b4 <
          *(uint *)&(in_RDI->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; local_11b4 = local_11b4 + 1) {
        for (local_11b8 = 0;
            local_11b8 <
            *(uint *)((long)&(in_RDI->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4);
            local_11b8 = local_11b8 + 1) {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x156e15);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->pattern_graph_rows,
                     (ulong)(local_11b8 *
                             *(int *)&(in_RDI->
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + local_11b4));
          uVar4 = SVOBitset::count((SVOBitset *)in_stack_ffffffffffffec00._M_node);
          std::
          unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
          ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        *)0x156e58);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
          puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0
                                      ,(size_type)in_stack_ffffffffffffebd8);
          *puVar6 = uVar4;
        }
        for (local_11bc = 0;
            local_11bc <
            *(uint *)&(in_RDI->
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_11bc = local_11bc + 1) {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x156ecd);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->target_graph_rows,
                     (ulong)(local_11bc *
                             *(int *)&(in_RDI->
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + local_11b4));
          uVar4 = SVOBitset::count((SVOBitset *)in_stack_ffffffffffffec00._M_node);
          std::
          unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
          ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        *)0x156f10);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffebe0,(size_type)in_stack_ffffffffffffebd8);
          puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffebe0
                                      ,(size_type)in_stack_ffffffffffffebd8);
          *puVar6 = uVar4;
        }
      }
      for (local_11c0 = 0;
          local_11c0 <
          *(uint *)&(in_RDI->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage; local_11c0 = local_11c0 + 1
          ) {
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x156f9d);
        in_stack_ffffffffffffec00._M_node = (_Base_ptr)&pIVar5->largest_target_degree;
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x156fb5);
        this_00 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&pIVar5->targets_degrees,0);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(ulong)local_11c0);
        piVar14 = std::max<int>((int *)in_stack_ffffffffffffec00._M_node,pvVar13);
        iVar18 = *piVar14;
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x156ff9);
        pIVar5->largest_target_degree = iVar18;
      }
      for (local_11c4 = 0;
          local_11c4 <
          *(uint *)((long)&(in_RDI->
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 4);
          local_11c4 = local_11c4 + 1) {
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x157049);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar5->pattern_loops,(ulong)local_11c4);
        if (*pvVar13 != 0) {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x157073);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->pattern_graph_rows,
                     (ulong)(local_11c4 *
                            *(int *)&(in_RDI->
                                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish));
          SVOBitset::set((SVOBitset *)in_stack_ffffffffffffec00._M_node,in_stack_ffffffffffffebfc);
        }
      }
      for (local_11c8 = 0;
          local_11c8 <
          *(uint *)&(in_RDI->
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage; local_11c8 = local_11c8 + 1
          ) {
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x1570f0);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar5->target_loops,(ulong)local_11c8);
        if (*pvVar13 != 0) {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x15711a);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->target_graph_rows,
                     (ulong)(local_11c8 *
                            *(int *)&(in_RDI->
                                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish));
          SVOBitset::set((SVOBitset *)in_stack_ffffffffffffec00._M_node,in_stack_ffffffffffffebfc);
        }
      }
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x157174);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffec00._M_node,
                 CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8));
      for (uVar4 = 0;
          uVar4 < *(uint *)&(in_RDI->
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish; uVar4 = uVar4 + 1) {
        for (uVar20 = 0;
            uVar20 < *(uint *)((long)&(in_RDI->
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 4);
            uVar20 = uVar20 + 1) {
          for (uVar19 = 0;
              uVar19 < *(uint *)((long)&(in_RDI->
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + 4);
              uVar19 = uVar19 + 1) {
            pIVar5 = std::
                     unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   *)0x157209);
            std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
            operator[](&pIVar5->pattern_graph_rows,
                       (ulong)(uVar20 * *(int *)&(in_RDI->
                                                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish + uVar4
                              ));
            bVar1 = SVOBitset::test((SVOBitset *)in_stack_ffffffffffffec00._M_node,
                                    in_stack_ffffffffffffebfc);
            if (bVar1) {
              in_stack_ffffffffffffebfc = 1 << ((byte)uVar4 & 0x1f);
              pIVar5 = std::
                       unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     *)0x157267);
              pbVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (&pIVar5->pattern_adjacencies_bits,
                                   (ulong)(uVar20 * *(int *)((long)&(in_RDI->
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish + 4) +
                                          uVar19));
              *pbVar15 = *pbVar15 | (byte)in_stack_ffffffffffffebfc;
            }
          }
        }
      }
      local_1 = 1;
      goto LAB_001572ec;
    }
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  std::__cxx11::to_string(in_stack_ffffffffffffec0c);
  std::operator+((char *)in_stack_ffffffffffffebe8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffebe0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffebe8,(char *)in_stack_ffffffffffffebe0);
  std::__cxx11::to_string(in_stack_ffffffffffffec0c);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffebe8,(char *)in_stack_ffffffffffffebe0);
  std::__cxx11::to_string(in_stack_ffffffffffffec0c);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffebe8,(char *)in_stack_ffffffffffffebe0);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x156ad6);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_ffffffffffffebe0);
  std::__cxx11::to_string((unsigned_long)__lhs);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10));
  UnsupportedConfiguration::UnsupportedConfiguration
            ((UnsupportedConfiguration *)in_stack_ffffffffffffebe0,
             (string *)in_stack_ffffffffffffebd8);
  __cxa_throw(__lhs,&UnsupportedConfiguration::typeinfo,
              UnsupportedConfiguration::~UnsupportedConfiguration);
LAB_0015435c:
  local_b8 = local_b8 + 1;
  goto LAB_00153bc1;
}

Assistant:

auto HomomorphismModel::prepare() -> bool
{
    if (is_nonshrinking(_imp->params) && (pattern_size > target_size))
        return false;

    _imp->supplemental_graph_names.push_back("original");

    // pattern and target degrees, for the main graph
    _imp->patterns_degrees.at(0).resize(pattern_size);
    _imp->targets_degrees.at(0).resize(target_size);

    for (unsigned i = 0; i < pattern_size; ++i)
        _imp->patterns_degrees.at(0).at(i) = _imp->pattern_graph_rows[i * max_graphs + 0].count();

    for (unsigned i = 0; i < target_size; ++i)
        _imp->targets_degrees.at(0).at(i) = _imp->target_graph_rows[i * max_graphs + 0].count();

    if (global_degree_is_preserved(_imp->params)) {
        vector<pair<int, int>> p_gds, t_gds;
        for (unsigned i = 0; i < pattern_size; ++i)
            p_gds.emplace_back(i, _imp->patterns_degrees.at(0).at(i));
        for (unsigned i = 0; i < target_size; ++i)
            t_gds.emplace_back(i, _imp->targets_degrees.at(0).at(i));

        sort(p_gds.begin(), p_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
        sort(t_gds.begin(), t_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

        for (unsigned i = 0; i < p_gds.size(); ++i)
            if (p_gds.at(i).second > t_gds.at(i).second) {
                if (_imp->proof) {
                    for (unsigned p = 0; p <= i; ++p) {
                        vector<int> n_p;
                        auto np = _imp->pattern_graph_rows[p_gds.at(p).first * max_graphs + 0];
                        for (unsigned j = 0; j < pattern_size; ++j)
                            if (np.test(j))
                                n_p.push_back(j);

                        for (unsigned t = i; t < t_gds.size(); ++t) {
                            vector<int> n_t;
                            auto nt = _imp->target_graph_rows[t_gds.at(t).first * max_graphs + 0];
                            for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                                nt.reset(j);
                                n_t.push_back(j);
                            }

                            _imp->proof->incompatible_by_degrees(0,
                                pattern_vertex_for_proof(p_gds.at(p).first), n_p,
                                target_vertex_for_proof(t_gds.at(t).first), n_t);
                        }
                    }

                    vector<NamedVertex> patterns, targets;
                    for (unsigned p = 0; p <= i; ++p)
                        patterns.push_back(pattern_vertex_for_proof(p_gds.at(p).first));
                    for (unsigned t = 0; t < i; ++t)
                        targets.push_back(target_vertex_for_proof(t_gds.at(t).first));

                    _imp->proof->emit_hall_set_or_violator(patterns, targets);
                }
                return false;
            }
    }

    unsigned next_pattern_supplemental = 1, next_target_supplemental = 1;
    // build exact path graphs
    if (supports_exact_path_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, false);

        if (_imp->proof) {
            for (int g = 1; g <= _imp->params.number_of_exact_path_graphs; ++g) {
                for (unsigned p = 0; p < pattern_size; ++p) {
                    for (unsigned q = 0; q < pattern_size; ++q) {
                        if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + g].test(q))
                            continue;

                        auto named_p = pattern_vertex_for_proof(p);
                        auto named_q = pattern_vertex_for_proof(q);

                        auto n_p_q = _imp->pattern_graph_rows[p * max_graphs + 0];
                        n_p_q &= _imp->pattern_graph_rows[q * max_graphs + 0];
                        vector<NamedVertex> between_p_and_q;
                        for (auto v = n_p_q.find_first(); v != decltype(n_p_q)::npos; v = n_p_q.find_first()) {
                            n_p_q.reset(v);
                            between_p_and_q.push_back(pattern_vertex_for_proof(v));
                            if (between_p_and_q.size() >= unsigned(g))
                                break;
                        }

                        for (unsigned t = 0; t < target_size; ++t) {
                            auto named_t = target_vertex_for_proof(t);

                            vector<NamedVertex> named_n_t, named_d_n_t;
                            vector<pair<NamedVertex, vector<NamedVertex>>> named_two_away_from_t;
                            auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                            for (auto w = n_t.find_first(); w != decltype(n_t)::npos; w = n_t.find_first()) {
                                n_t.reset(w);
                                named_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto nd_t = _imp->target_graph_rows[t * max_graphs + g];
                            for (auto w = nd_t.find_first(); w != decltype(nd_t)::npos; w = nd_t.find_first()) {
                                nd_t.reset(w);
                                named_d_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto n2_t = _imp->target_graph_rows[t * max_graphs + 1];
                            for (auto w = n2_t.find_first(); w != decltype(n2_t)::npos; w = n2_t.find_first()) {
                                n2_t.reset(w);
                                auto n_t_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_t_w &= _imp->target_graph_rows[t * max_graphs + 0];
                                vector<NamedVertex> named_n_t_w;
                                for (auto x = n_t_w.find_first(); x != decltype(n_t_w)::npos; x = n_t_w.find_first()) {
                                    n_t_w.reset(x);
                                    named_n_t_w.push_back(target_vertex_for_proof(x));
                                }
                                named_two_away_from_t.emplace_back(target_vertex_for_proof(w), named_n_t_w);
                            }

                            _imp->proof->create_exact_path_graphs(g, named_p, named_q, between_p_and_q,
                                named_t, named_n_t, named_two_away_from_t, named_d_n_t);
                        }
                    }
                }
            }
        }
    }

    if (supports_distance2_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, 1, _imp->directed, true, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, 1, _imp->directed, true, false);
    }

    if (supports_distance3_graphs(_imp->params)) {
        _build_distance3_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_distance3_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    bool actually_adjacent = false;
                    optional<NamedVertex> path_from_p_to_q_1 = nullopt, path_from_p_to_q_2 = nullopt;

                    auto n_p = _imp->pattern_graph_rows[p * max_graphs + 0];

                    // are they actually distance 1 apart?
                    if (n_p.test(q))
                        actually_adjacent = true;
                    else {
                        auto n_q = _imp->pattern_graph_rows[q * max_graphs + 0];

                        auto n_p_q = n_p;
                        n_p_q &= n_q;
                        n_p_q.reset(p);
                        n_p_q.reset(q);

                        if (n_p_q.any()) {
                            // they're actually distance 2 apart
                            path_from_p_to_q_1 = pattern_vertex_for_proof(n_p_q.find_first());
                        }
                        else {
                            // find a path of length 3
                            n_p.reset(p);
                            n_p.reset(q);
                            for (auto v = n_p.find_first(); v != decltype(n_p)::npos && ! path_from_p_to_q_1; v = n_p.find_first()) {
                                n_p.reset(v);
                                auto n_v = _imp->pattern_graph_rows[v * max_graphs + 0];
                                n_v.reset(v);
                                n_v.reset(p);
                                n_v.reset(q);
                                for (auto w = n_v.find_first(); w != decltype(n_v)::npos && ! path_from_p_to_q_1; w = n_v.find_first()) {
                                    n_v.reset(w);
                                    if (_imp->pattern_graph_rows[w * max_graphs + 0].test(q)) {
                                        path_from_p_to_q_1 = pattern_vertex_for_proof(v);
                                        path_from_p_to_q_2 = pattern_vertex_for_proof(w);
                                    }
                                }
                            }
                        }

                        if (! path_from_p_to_q_1)
                            throw ProofError{"Oops, there's a bug: missing path from " + named_p.second + " to " + named_q.second};
                    }

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);

                        vector<NamedVertex> d1_from_t, d2_from_t, d3_from_t;
                        set<NamedVertex> d2_from_t_set, d3_from_t_set;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                        n_t.set(t);
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            d1_from_t.push_back(target_vertex_for_proof(v));
                            auto n_v = _imp->target_graph_rows[v * max_graphs + 0];
                            n_v.set(v);
                            for (auto w = n_v.find_first(); w != decltype(n_v)::npos; w = n_v.find_first()) {
                                n_v.reset(w);
                                d2_from_t_set.insert(target_vertex_for_proof(w));
                                auto n_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_w.set(w);
                                for (auto x = n_w.find_first(); x != decltype(n_w)::npos; x = n_w.find_first()) {
                                    n_w.reset(x);
                                    d3_from_t_set.insert(target_vertex_for_proof(x));
                                }
                            }
                        }

                        d2_from_t.assign(d2_from_t_set.begin(), d2_from_t_set.end());
                        d3_from_t.assign(d3_from_t_set.begin(), d3_from_t_set.end());

                        if (actually_adjacent)
                            _imp->proof->create_distance3_graphs_but_actually_distance_1(next_pattern_supplemental - 1, named_p, named_q, named_t, d3_from_t);
                        else if (path_from_p_to_q_2)
                            _imp->proof->create_distance3_graphs(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                *path_from_p_to_q_2, named_t, d1_from_t, d2_from_t, d3_from_t);
                        else
                            _imp->proof->create_distance3_graphs_but_actually_distance_2(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                named_t, d1_from_t, d2_from_t, d3_from_t);
                    }
                }
            }
        }
    }

    if (supports_k4_graphs(_imp->params)) {
        _build_k4_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_k4_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);
    }

    for (auto & [shape, injective, count] : _imp->params.extra_shapes) {
        _build_extra_shape(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, *shape, injective, count, true);
        _build_extra_shape(_imp->target_graph_rows, target_size, next_target_supplemental, *shape, injective, count, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);
                        vector<NamedVertex> named_n_t;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + next_pattern_supplemental - 1];
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            named_n_t.push_back(target_vertex_for_proof(v));
                        }
                        _imp->proof->hack_in_shape_graph(next_pattern_supplemental - 1, named_p, named_q, named_t, named_n_t);
                    }
                }
            }
        }
    }

    if (next_pattern_supplemental != max_graphs || next_target_supplemental != max_graphs ||
            next_pattern_supplemental != _imp->supplemental_graph_names.size())
        throw UnsupportedConfiguration{"something has gone wrong with supplemental graph indexing: " + to_string(next_pattern_supplemental) + " " + to_string(next_target_supplemental) + " " + to_string(max_graphs) + " "
        + to_string(_imp->supplemental_graph_names.size())};

    // pattern and target degrees, for supplemental graphs
    for (unsigned g = 1; g < max_graphs; ++g) {
        _imp->patterns_degrees.at(g).resize(pattern_size);
        _imp->targets_degrees.at(g).resize(target_size);
    }

    for (unsigned g = 1; g < max_graphs; ++g) {
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->patterns_degrees.at(g).at(i) = _imp->pattern_graph_rows[i * max_graphs + g].count();

        for (unsigned i = 0; i < target_size; ++i)
            _imp->targets_degrees.at(g).at(i) = _imp->target_graph_rows[i * max_graphs + g].count();
    }

    for (unsigned i = 0; i < target_size; ++i)
        _imp->largest_target_degree = max(_imp->largest_target_degree, _imp->targets_degrees[0][i]);

    // re-add loops
    for (unsigned i = 0; i < pattern_size; ++i)
        if (_imp->pattern_loops[i])
            _imp->pattern_graph_rows[i * max_graphs + 0].set(i);

    for (unsigned i = 0; i < target_size; ++i)
        if (_imp->target_loops[i])
            _imp->target_graph_rows[i * max_graphs + 0].set(i);

    // pattern adjacencies, compressed
    _imp->pattern_adjacencies_bits.resize(pattern_size * pattern_size);
    for (unsigned g = 0; g < max_graphs; ++g)
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (_imp->pattern_graph_rows[i * max_graphs + g].test(j))
                    _imp->pattern_adjacencies_bits[i * pattern_size + j] |= (1u << g);

    return true;
}